

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O0

ssize_t __thiscall diffusion::ShmReader::read(ShmReader *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  ErrorNoData *this_00;
  char *byte_pointer;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  vector<char,_std::allocator<char>_> *this_01;
  int body_size;
  vector<char,_std::allocator<char>_> *buffer_local;
  ShmReader *this_local;
  
  this_01 = (vector<char,_std::allocator<char>_> *)CONCAT44(in_register_00000034,__fd);
  uVar1 = (**(this->super_Reader)._vptr_Reader)();
  if ((uVar1 & 1) == 0) {
    this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
    ErrorNoData::ErrorNoData(this_00);
    __cxa_throw(this_00,&ErrorNoData::typeinfo,ErrorNoData::~ErrorNoData);
  }
  std::vector<char,_std::allocator<char>_>::resize(this_01,4);
  cyclic_read(this,this_01);
  byte_pointer = std::vector<char,_std::allocator<char>_>::data(this_01);
  iVar2 = read_aligned_object<int>(byte_pointer);
  std::vector<char,_std::allocator<char>_>::resize(this_01,(long)iVar2);
  cyclic_read(this,this_01);
  return extraout_RAX;
}

Assistant:

void ShmReader::read(std::vector<char> &buffer) {
    if (!this->can_read()) {
        throw ErrorNoData();
    }
    buffer.resize(sizeof(Size));
    this->cyclic_read(buffer); // avoid unaligned access.
    auto body_size = read_aligned_object<Size>(buffer.data());
    buffer.resize(body_size);
    this->cyclic_read(buffer);
}